

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void sat_solver2_reducedb(sat_solver2 *s)

{
  Sat_Mem_t *p;
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  uint nSize;
  Prf_Man_t *pPVar3;
  Vec_Int_t *p_00;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  abctime aVar8;
  int *pCosts;
  clause *pcVar9;
  int *piVar10;
  ulong uVar11;
  word *pwVar12;
  long lVar13;
  abctime aVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  clause cVar18;
  ulong uVar19;
  veci *pvVar20;
  Vec_Set_t *vProof;
  int iVar21;
  long lVar22;
  long lVar23;
  double dVar24;
  
  nSize = (s->act_clas).size;
  piVar10 = (s->act_clas).ptr;
  aVar8 = Abc_Clock();
  sat_solver2_reducedb::Count = sat_solver2_reducedb::Count + 1;
  if (s->nLearntMax == 0) {
    __assert_fail("s->nLearntMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x58b,"void sat_solver2_reducedb(sat_solver2 *)");
  }
  p = &s->Mem;
  iVar4 = s->nDBreduces + 1;
  s->nDBreduces = iVar4;
  iVar4 = iVar4 * s->nLearntDelta + s->nLearntStart;
  s->nLearntMax = iVar4;
  iVar5 = iVar4 / -0x14 + nSize;
  iVar4 = s->nLearntRatio;
  pCosts = (int *)malloc((long)(int)nSize * 4);
  lVar22 = 1;
  pcVar9 = (clause *)0x0;
  do {
    if ((s->Mem).iPage[1] < lVar22) {
      piVar10 = Abc_MergeSortCost(pCosts,nSize);
      if (pCosts[piVar10[(long)(int)nSize + -1]] < pCosts[*piVar10]) {
        __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x5af,"void sat_solver2_reducedb(sat_solver2 *)");
      }
      iVar4 = pCosts[piVar10[(int)((int)(iVar4 * nSize) / -100 + nSize)]];
      free(piVar10);
      iVar21 = 0;
      lVar22 = 1;
      iVar17 = 0;
      do {
        uVar11 = (ulong)(s->Mem).iPage[1];
        if ((long)uVar11 < lVar22) {
          if (iVar21 < (int)nSize / 6) {
            free(pCosts);
            return;
          }
          uVar6 = 0;
          if ((s->claProofs).size == 0) {
            piVar10 = (int *)0x0;
          }
          else {
            piVar10 = (s->claProofs).ptr;
          }
          lVar22 = 1;
          uVar15 = 0;
          do {
            if ((int)uVar11 < lVar22) {
              free(pCosts);
              pPVar3 = s->pPrf2;
              if (pPVar3 != (Prf_Man_t *)0x0) {
                if (pPVar3->iFirst < 0) {
                  __assert_fail("p->iFirst >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                ,0xbe,"void Prf_ManCompact(Prf_Man_t *, int)");
                }
                if (pPVar3->pInfo != (word *)0x0) {
                  __assert_fail("p->pInfo == NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                ,0xbf,"void Prf_ManCompact(Prf_Man_t *, int)");
                }
                iVar4 = pPVar3->vInfo->nSize;
                iVar5 = pPVar3->nWords;
                uVar16 = 0;
                iVar21 = 0;
                while( true ) {
                  p_00 = pPVar3->vSaved;
                  if (p_00->nSize <= iVar21) break;
                  iVar17 = Vec_IntEntry(p_00,iVar21);
                  iVar17 = iVar17 - pPVar3->iFirst;
                  if ((iVar17 < 0) || (iVar4 / iVar5 <= iVar17)) {
                    __assert_fail("Entry - p->iFirst >= 0 && Entry - p->iFirst < nSize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                  ,0xc3,"void Prf_ManCompact(Prf_Man_t *, int)");
                  }
                  pwVar12 = Prf_ManClauseInfo(pPVar3,iVar17);
                  pPVar3->pInfo = pwVar12;
                  uVar11 = (ulong)(uint)pPVar3->nWords;
                  if (pPVar3->nWords < 1) {
                    uVar11 = 0;
                  }
                  for (uVar19 = 0; uVar11 != uVar19; uVar19 = uVar19 + 1) {
                    if (((int)uVar16 < 0) || (pPVar3->vInfo->nSize <= (int)(uVar16 + (int)uVar19)))
                    {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                                    ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
                    }
                    pPVar3->vInfo->pArray[uVar16 + uVar19] = pwVar12[uVar19];
                  }
                  uVar16 = uVar16 + (int)uVar19;
                  iVar21 = iVar21 + 1;
                }
                if (pPVar3->vInfo->nSize < (int)uVar16) {
                  __assert_fail("p->nSize >= nSizeNew",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                                ,0x255,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
                }
                pPVar3->vInfo->nSize = uVar16;
                p_00->nSize = 0;
                pPVar3->pInfo = (word *)0x0;
                uVar16 = pPVar3->iFirst2;
                if (pPVar3->iFirst2 == 0xffffffff) {
                  uVar16 = uVar6;
                }
                pPVar3->iFirst = uVar16;
                pPVar3->iFirst2 = -1;
              }
              if ((s->stats).learnts != uVar6) {
                __assert_fail("s->stats.learnts == (unsigned)j",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x5e3,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              if (uVar15 != nSize) {
                __assert_fail("Counter == nLearnedOld",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x5e4,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              veci_resize(&s->act_clas,uVar6);
              if ((s->claProofs).size != 0) {
                veci_resize(&s->claProofs,uVar6);
              }
              uVar6 = Sat_MemCompactLearned(p,0);
              if (uVar6 != (s->stats).learnts) {
                __assert_fail("Counter == (int)s->stats.learnts",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x5eb,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              for (lVar22 = 0; uVar11 = (ulong)s->size, lVar22 < (long)uVar11; lVar22 = lVar22 + 1)
              {
                uVar6 = s->reasons[lVar22];
                if (((uVar6 & 1) == 0 && uVar6 != 0) && (((s->Mem).uLearnedMask & uVar6) != 0)) {
                  if (((uint)*pcVar9 & 1) == 0) {
                    __assert_fail("c->lrn",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                  ,0x5f6,"void sat_solver2_reducedb(sat_solver2 *)");
                  }
                  pcVar9 = Sat_MemClauseHand(p,uVar6);
                  if (((uint)*pcVar9 & 2) != 0) {
                    __assert_fail("c->mark == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                  ,0x5f8,"void sat_solver2_reducedb(sat_solver2 *)");
                  }
                  *(clause *)(s->reasons + lVar22) = pcVar9[(ulong)((uint)*pcVar9 >> 0xb) + 1];
                }
              }
              lVar22 = 0;
              do {
                if ((int)uVar11 * 2 <= lVar22) {
                  if (s->fProofLogging != 0) {
                    for (lVar22 = 0; lVar22 < (int)uVar11; lVar22 = lVar22 + 1) {
                      uVar6 = s->units[lVar22];
                      if ((uVar6 != 0) && (((s->Mem).uLearnedMask & uVar6) != 0)) {
                        if (((uint)*pcVar9 & 1) == 0) {
                          __assert_fail("c->lrn",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                        ,0x616,"void sat_solver2_reducedb(sat_solver2 *)");
                        }
                        pcVar9 = Sat_MemClauseHand(p,uVar6);
                        if (((uint)*pcVar9 & 2) != 0) {
                          __assert_fail("c->mark == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                        ,0x618,"void sat_solver2_reducedb(sat_solver2 *)");
                        }
                        *(clause *)(s->units + lVar22) = pcVar9[(ulong)((uint)*pcVar9 >> 0xb) + 1];
                        uVar11 = (ulong)(uint)s->size;
                      }
                    }
                  }
                  uVar6 = Sat_MemCompactLearned(p,1);
                  if (uVar6 != (s->stats).learnts) {
                    __assert_fail("Counter == (int)s->stats.learnts",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                  ,0x61e,"void sat_solver2_reducedb(sat_solver2 *)");
                  }
                  vProof = s->pPrf1;
                  if (vProof != (Vec_Set_t *)0x0) {
                    iVar4 = Sat_ProofReduce(vProof,&s->claProofs,s->hProofPivot);
                    s->hProofPivot = iVar4;
                  }
                  iVar4 = (int)vProof;
                  aVar14 = Abc_Clock();
                  sat_solver2_reducedb::TimeTotal =
                       sat_solver2_reducedb::TimeTotal + (aVar14 - aVar8);
                  if (s->fVerbose != 0) {
                    uVar11 = (ulong)(s->stats).learnts;
                    Abc_Print(iVar4,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
                              ((double)uVar11 * 100.0) / (double)(int)nSize,uVar11,(ulong)nSize);
                    dVar24 = (double)sat_solver2_reducedb::TimeTotal;
                    Abc_Print(iVar4,"%s =","Time");
                    Abc_Print(iVar4,"%9.2f sec\n",dVar24 / 1000000.0);
                    return;
                  }
                  return;
                }
                pvVar20 = s->wlists;
                piVar10 = pvVar20[lVar22].ptr;
                iVar4 = 0;
                for (lVar23 = 0; lVar23 < pvVar20[lVar22].size; lVar23 = lVar23 + 1) {
                  cVar18 = *(clause *)(piVar10 + lVar23);
                  if ((((uint)cVar18 & 1) == 0) && (((s->Mem).uLearnedMask & (uint)cVar18) != 0)) {
                    if (((uint)*pcVar9 & 1) == 0) {
                      __assert_fail("c->lrn",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                    ,0x608,"void sat_solver2_reducedb(sat_solver2 *)");
                    }
                    pcVar9 = Sat_MemClauseHand(p,(cla)cVar18);
                    if (((uint)*pcVar9 & 2) == 0) {
                      cVar18 = pcVar9[(ulong)((uint)*pcVar9 >> 0xb) + 1];
                      goto LAB_004363ee;
                    }
                  }
                  else {
LAB_004363ee:
                    lVar13 = (long)iVar4;
                    iVar4 = iVar4 + 1;
                    *(clause *)(piVar10 + lVar13) = cVar18;
                  }
                  pvVar20 = s->wlists;
                }
                veci_resize(pvVar20 + lVar22,iVar4);
                lVar22 = lVar22 + 1;
                uVar11 = (ulong)(uint)s->size;
              } while( true );
            }
            for (uVar16 = 2; (int)uVar16 < *(s->Mem).pPages[lVar22];
                uVar16 = uVar16 + (((uint)*pcVar9 & 1) + ((uint)*pcVar9 >> 0xb) + 2 & 0xfffffffe)) {
              pcVar9 = Sat_MemClause(p,(int)lVar22,uVar16);
              if (pcVar9 == (clause *)0x0) {
                pcVar9 = (clause *)0x0;
                break;
              }
              cVar18 = *pcVar9;
              if (((uint)cVar18 & 2) != 0) {
                __assert_fail("c->mark == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x5cc,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              uVar7 = (uint)cVar18 >> 0xb;
              if ((((iVar5 < (int)uVar15) || ((uint)cVar18 < 0x1000)) ||
                  (iVar4 <= pCosts[(int)pcVar9[(ulong)uVar7 + 1]])) ||
                 (s->reasons[(int)pcVar9[1] >> 1] ==
                  ((int)lVar22 << ((byte)(s->Mem).nPageSize & 0x1f) | uVar16))) {
                pCosts[(int)uVar6] = pCosts[(int)pcVar9[(ulong)uVar7 + 1]];
                if (piVar10 != (int *)0x0) {
                  piVar10[(int)uVar6] = piVar10[(int)pcVar9[(ulong)((uint)*pcVar9 >> 0xb) + 1]];
                }
                pPVar3 = s->pPrf2;
                if (pPVar3 != (Prf_Man_t *)0x0) {
                  if (pPVar3->iFirst < 0) {
                    __assert_fail("p->iFirst >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                  ,0xb1,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
                  }
                  cVar18 = pcVar9[(ulong)((uint)*pcVar9 >> 0xb) + 1];
                  if (pPVar3->iFirst <= (int)cVar18) {
                    if (pPVar3->vSaved->nSize == 0) {
                      if (pPVar3->iFirst2 != -1) {
                        __assert_fail("p->iFirst2 == -1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                      ,0xb6,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
                      }
                      pPVar3->iFirst2 = uVar6;
                    }
                    Vec_IntPush(pPVar3->vSaved,(int)cVar18);
                  }
                }
                uVar6 = uVar6 + 1;
              }
              else {
                *pcVar9 = (clause)((uint)cVar18 | 2);
                pAVar1 = &(s->stats).learnts_literals;
                *pAVar1 = *pAVar1 - (ulong)uVar7;
                puVar2 = &(s->stats).learnts;
                *puVar2 = *puVar2 - 1;
              }
              uVar15 = uVar15 + 1;
            }
            lVar22 = lVar22 + 2;
            uVar11 = (ulong)(uint)(s->Mem).iPage[1];
          } while( true );
        }
        for (uVar6 = 2; (int)uVar6 < *(s->Mem).pPages[lVar22];
            uVar6 = uVar6 + (((uint)cVar18 & 1) + ((uint)cVar18 >> 0xb) + 2 & 0xfffffffe)) {
          pcVar9 = Sat_MemClause(p,(int)lVar22,uVar6);
          if (pcVar9 == (clause *)0x0) {
            pcVar9 = (clause *)0x0;
            break;
          }
          cVar18 = *pcVar9;
          if (((uint)cVar18 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5b8,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          if (((iVar17 <= iVar5) && (0xfff < (uint)cVar18)) &&
             (pCosts[(int)pcVar9[(ulong)((uint)cVar18 >> 0xb) + 1]] < iVar4)) {
            iVar21 = iVar21 + (uint)(s->reasons[(int)pcVar9[1] >> 1] !=
                                    ((int)lVar22 << ((byte)(s->Mem).nPageSize & 0x1f) | uVar6));
          }
          if ((int)nSize / 6 <= iVar21) {
            iVar17 = iVar17 + 1;
            break;
          }
          iVar17 = iVar17 + 1;
        }
        lVar22 = lVar22 + 2;
      } while( true );
    }
    for (iVar21 = 2; iVar21 < *(s->Mem).pPages[lVar22];
        iVar21 = iVar21 + (((uint)*pcVar9 & 1) + ((uint)*pcVar9 >> 0xb) + 2 & 0xfffffffe)) {
      pcVar9 = Sat_MemClause(p,(int)lVar22,iVar21);
      if (pcVar9 == (clause *)0x0) {
        pcVar9 = (clause *)0x0;
        break;
      }
      uVar6 = (uint)*pcVar9 >> 3 & 0xff;
      if (6 < uVar6) {
        uVar6 = 7;
      }
      uVar15 = piVar10[(int)pcVar9[(ulong)((uint)*pcVar9 >> 0xb) + 1]] >> 4;
      pCosts[(int)pcVar9[(ulong)((uint)*pcVar9 >> 0xb) + 1]] = (uVar6 ^ 7) << 0x1c | uVar15;
      if ((int)uVar15 < 0) {
        __assert_fail("pSortValues[Id] >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0x5ab,"void sat_solver2_reducedb(sat_solver2 *)");
      }
    }
    lVar22 = lVar22 + 2;
  } while( true );
}

Assistant:

void sat_solver2_reducedb(sat_solver2* s)
{
    static abctime TimeTotal = 0;
    Sat_Mem_t * pMem = &s->Mem;
    clause * c = NULL;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pSortValues, nCutoffValue, * pClaProofs;
    int i, j, k, Id, nSelected;//, LastSize = 0;
    int Counter, CounterStart;
    abctime clk = Abc_Clock();
    static int Count = 0;
    Count++;
    assert( s->nLearntMax );
    s->nDBreduces++;
//    printf( "Calling reduceDB with %d clause limit and parameters (%d %d %d).\n", s->nLearntMax, s->nLearntStart, s->nLearntDelta, s->nLearntRatio );

/*
    // find the new limit
    s->nLearntMax = s->nLearntMax * 11 / 10;
    // preserve 1/10 of last clauses
    CounterStart  = s->stats.learnts - (s->nLearntMax / 10);
    // preserve 1/10 of most active clauses
    pSortValues = veci_begin(&s->act_clas);
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld*9/10]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;
*/


    // find the new limit
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);
    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;
    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
        pSortValues[Id] = (((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4));
//        pSortValues[Id] = act_clas[Id];
        assert( pSortValues[Id] >= 0 );
    }
    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;

    // count how many clauses satisfy the condition
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
        }
        else
            j++;
        if ( j >= nLearnedOld / 6 )
            break;
    }
    if ( j < nLearnedOld / 6 )
    {
        ABC_FREE( pSortValues );
        return;
    }

    // mark learned clauses to remove
    Counter = j = 0;
    pClaProofs = veci_size(&s->claProofs) ? veci_begin(&s->claProofs) : NULL;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
            pSortValues[j] = pSortValues[clause_id(c)];
            if ( pClaProofs ) 
                pClaProofs[j] = pClaProofs[clause_id(c)];
            if ( s->pPrf2 )
                Prf_ManAddSaved( s->pPrf2, clause_id(c), j );
            j++;
        }
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    ABC_FREE( pSortValues );
    if ( s->pPrf2 )
        Prf_ManCompact( s->pPrf2, j );
//    if ( j == nLearnedOld )
//        return;

    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    if ( veci_size(&s->claProofs) )
        veci_resize(&s->claProofs,j);

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        assert( c->lrn );
        c = clause2_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                assert( c->lrn );
                c = clause2_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // compact units
    if ( s->fProofLogging )
        for ( i = 0; i < s->size; i++ )
            if ( s->units[i] && clause_learnt_h(pMem, s->units[i]) )
            {
                assert( c->lrn );
                c = clause2_read( s, s->units[i] );
                assert( c->mark == 0 );
                s->units[i] = clause_id(c);
            }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // compact proof (compacts 'proofs' and update 'claProofs')
    if ( s->pPrf1 )
    {
        extern int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot );
        s->hProofPivot = Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
        Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
            s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
}